

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::set_user_ctx(raft_server *this,string *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ptr<cluster_config> cloned_config;
  ptr<log_entry> entry;
  ptr<buffer> new_conf_buf;
  ptr<buffer> enc_conf;
  ptr<cluster_config> c_conf;
  undefined1 local_79;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  log_val_type local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28 [2];
  
  get_config((raft_server *)(local_40 + 0x10));
  cluster_config::serialize((cluster_config *)local_40);
  cluster_config::deserialize((cluster_config *)local_78,(buffer *)local_40._0_8_);
  uVar1 = local_78._0_8_;
  uVar2 = (**(code **)(*(long *)(this->log_store_).
                                super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 0x10))();
  *(undefined8 *)(uVar1 + 8) = *(undefined8 *)uVar1;
  *(undefined8 *)uVar1 = uVar2;
  std::__cxx11::string::_M_assign((string *)(local_78._0_8_ + 0x18));
  cluster_config::serialize((cluster_config *)local_50);
  local_68._0_8_ =
       (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       term_).super___atomic_base<unsigned_long>._M_i;
  local_79 = 2;
  local_28[1]._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)timer_helper::get_timeofday_us();
  std::
  make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
            ((unsigned_long *)(local_68 + 8),(shared_ptr<nuraft::buffer> *)local_68,local_50,
             (unsigned_long *)&local_79);
  store_log_entry(this,(ptr<log_entry> *)(local_68 + 8),0);
  request_append_entries(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_28);
  return;
}

Assistant:

void raft_server::set_user_ctx(const std::string& ctx) {
    // Clone current cluster config.
    ptr<cluster_config> c_conf = get_config();
    ptr<buffer> enc_conf = c_conf->serialize();
    ptr<cluster_config> cloned_config = cluster_config::deserialize(*enc_conf);

    // Create a log for new configuration, it should be replicated.
    cloned_config->set_log_idx(log_store_->next_slot());
    cloned_config->set_user_ctx(ctx);

    ptr<buffer> new_conf_buf = cloned_config->serialize();
    ptr<log_entry> entry = cs_new<log_entry>
                           ( state_->get_term(),
                             new_conf_buf,
                             log_val_type::conf,
                             timer_helper::get_timeofday_us() );
    store_log_entry(entry);
    request_append_entries();
}